

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O3

void Bmc_MeshTest2(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  sat_solver *s;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  timespec *ptVar8;
  timespec *ptVar9;
  uint uVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  long lVar12;
  abctime time;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  timespec *ptVar17;
  undefined1 *puVar18;
  uint uVar19;
  lit *begin;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  timespec *ptVar29;
  ulong uVar30;
  int Lit;
  int iGVars [4];
  int iTVars [4];
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  undefined8 uVar31;
  undefined4 uVar32;
  int local_a8dc;
  timespec *local_a8d8;
  timespec *local_a8d0;
  ulong local_a8c8;
  uint local_a8bc;
  ulong local_a8b8;
  ulong local_a8b0;
  ulong local_a8a8;
  ulong local_a8a0;
  timespec *local_a898;
  timespec *local_a890;
  timespec *local_a888;
  timespec *local_a880;
  int local_a878;
  uint local_a874;
  ulong local_a870;
  ulong local_a868;
  ulong local_a860;
  ulong local_a858;
  uint local_a850;
  uint local_a84c;
  long local_a848;
  ulong local_a840;
  int local_a834;
  int local_a830;
  int local_a82c;
  int local_a828 [4];
  int local_a818 [4];
  ulong local_a808;
  ulong local_a800;
  ulong local_a7f8;
  ulong local_a7f0;
  ulong local_a7e8;
  ulong local_a7e0;
  ulong local_a7d8;
  ulong local_a7d0;
  ulong local_a7c8;
  lit *local_a7c0;
  ulong local_a7b8;
  ulong local_a7b0;
  long local_a7a8;
  long local_a7a0;
  long local_a798;
  ulong local_a790;
  timespec local_a788;
  lit local_a778 [13];
  lit local_a744 [81];
  int aiStack_a600 [205];
  int iStack_a2cc;
  timespec local_a2c8 [25];
  int local_a12c;
  int local_40;
  int local_3c;
  
  local_a8c8 = CONCAT44(in_register_00000014,Y);
  local_a878 = fVerbose;
  iVar3 = clock_gettime(3,local_a2c8);
  if (iVar3 < 0) {
    local_a848 = -1;
  }
  else {
    local_a848 = local_a2c8[0].tv_nsec / 1000 + local_a2c8[0].tv_sec * 1000000;
  }
  s = sat_solver_new();
  memset(local_a2c8,0,0xa290);
  memset(aiStack_a600 + 2,0,0x330);
  if (((X < 0x65) && ((int)local_a8c8 < 0x65)) && (T < 0x65)) {
    uVar11 = p->nRegs;
    local_a8a8 = (ulong)uVar11;
    local_a8b8 = (ulong)(uint)p->nObjs;
    uVar19 = p->vCis->nSize;
    local_a860 = (ulong)uVar19;
    uVar10 = uVar19 - uVar11;
    local_a870 = (ulong)uVar10;
    uVar16 = p->vCos->nSize;
    local_a8d0 = (timespec *)(ulong)~(uVar19 + uVar16);
    iVar3 = p->nObjs + uVar10 + ~(uVar19 + uVar16);
    if (iVar3 < 0x65) {
      if (0 < (int)uVar10) {
        memset(aiStack_a600 + 2,0xff,(ulong)(~uVar11 + uVar19) * 8 + 8);
      }
      if ((0 < (int)local_a8b8) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
        lVar12 = -1;
        do {
          uVar31 = *(undefined8 *)pGVar6;
          uVar11 = (uint)uVar31;
          if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
            aiStack_a600[lVar12 * 2 + 2] = (int)lVar12 - (uVar11 & 0x1fffffff);
            aiStack_a600[lVar12 * 2 + 3] =
                 (int)lVar12 - ((uint)((ulong)uVar31 >> 0x20) & 0x1fffffff);
          }
          pGVar6 = pGVar6 + 1;
          lVar1 = lVar12 - local_a8b8;
          lVar12 = lVar12 + 1;
        } while (lVar1 != -2);
      }
      iVar13 = (int)local_a870;
      local_a800 = (long)(int)local_a870;
      local_a8b0 = (ulong)(uint)X;
      local_a8a0 = (ulong)(uint)T;
      if (local_a878 != 0) {
        printf("The graph has %d inputs: ",local_a870 & 0xffffffff);
        if (0 < iVar13) {
          iVar13 = (int)local_a8a8 - (int)local_a860;
          uVar27 = 0x61;
          do {
            printf("%c ",uVar27);
            iVar14 = (int)uVar27;
            uVar27 = (ulong)(iVar14 + 1);
          } while (iVar13 + iVar14 != 0x60);
        }
        printf("  and %d nodes: ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
        uVar27 = local_a800;
        iVar13 = (int)local_a870;
        if (iVar13 < iVar3) {
          iVar14 = (int)local_a8d0;
          iVar26 = (int)local_a8b8;
          lVar12 = 0;
          do {
            printf("%c=%c%c ",(ulong)(uint)(iVar13 + 0x61 + (int)lVar12),
                   (ulong)(aiStack_a600[uVar27 * 2 + lVar12 * 2 + 2] + 0x61),
                   (ulong)(aiStack_a600[uVar27 * 2 + lVar12 * 2 + 3] + 0x61));
            lVar12 = lVar12 + 1;
          } while (iVar14 + iVar26 != (int)lVar12);
        }
        putchar(10);
      }
      uVar25 = local_a8a0;
      uVar30 = local_a8b0;
      uVar27 = local_a8c8;
      iVar13 = (int)local_a8c8;
      iVar26 = (int)local_a8b0;
      iVar14 = (int)local_a8a0;
      if (iVar13 < 1) {
        uVar24 = 0;
      }
      else {
        uVar21 = 0;
        ptVar8 = local_a2c8;
        uVar24 = 0;
        do {
          if (0 < iVar26) {
            lVar12 = 0;
            do {
              *(int *)((long)&ptVar8->tv_sec + lVar12) = (int)uVar24;
              lVar12 = lVar12 + 0x198;
              uVar24 = (ulong)((int)uVar24 +
                              (((int)local_a8b8 + iVar14) - ((int)local_a8a8 + uVar16)) + 0x10);
            } while ((local_a8b0 & 0xffffffff) * 0x198 - lVar12 != 0);
          }
          uVar21 = uVar21 + 1;
          ptVar8 = (timespec *)((long)&ptVar8->tv_sec + 4);
        } while (uVar21 != (local_a8c8 & 0xffffffff));
      }
      local_40 = iVar14;
      local_3c = iVar3;
      if (local_a878 != 0) {
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar24,(ulong)(uint)(iVar13 * iVar26 * iVar14),
               (ulong)(uint)(iVar3 * iVar13 * iVar26));
      }
      uVar11 = iVar26 - 1;
      uVar19 = iVar13 - 1;
      iVar13 = (int)local_a8a8;
      local_a874 = uVar19;
      local_a84c = uVar11;
      if (iVar26 < 1) {
        local_a850 = iVar13 + uVar16;
        local_a8bc = ~local_a850 + (int)local_a8b8;
      }
      else {
        local_a850 = iVar13 + uVar16;
        local_a8bc = ~local_a850 + (int)local_a8b8;
        local_a890 = (timespec *)(ulong)uVar19;
        local_a898 = (timespec *)(ulong)uVar11;
        local_a888 = (timespec *)(uVar27 & 0xffffffff);
        local_a8d0 = (timespec *)(ulong)(uint)((int)local_a8d0 + (int)local_a8b8);
        local_a8d8 = (timespec *)CONCAT44(local_a8d8._4_4_,((int)local_a860 + iVar14) - iVar13);
        ptVar8 = (timespec *)0x0;
        local_a868 = (ulong)uVar16;
        do {
          ptVar9 = ptVar8;
          if (0 < (int)uVar27) {
            ptVar17 = (timespec *)0x0;
            local_a880 = ptVar8;
            do {
              iVar13 = *(int *)((long)local_a2c8 + (long)ptVar17 * 4 + (long)ptVar8 * 0x198);
              if ((local_a880 == (timespec *)0x0) ||
                 ((ptVar17 == (timespec *)0x0 || local_a880 == local_a898) || ptVar17 == local_a890)
                 ) {
                if (0 < (int)local_a8a0) {
                  iVar14 = iVar13 * 2;
                  iVar26 = 0;
                  do {
                    if (iVar13 < 0) goto LAB_005bcc8b;
                    local_a8dc = (iVar14 + 1) - (uint)(iVar26 == 0);
                    iVar4 = sat_solver_addclause(s,&local_a8dc,(lit *)&local_a8d8);
                    if (iVar4 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                    ,0xac,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar26 = iVar26 + 1;
                    iVar14 = iVar14 + 2;
                  } while ((int)local_a8a0 != iVar26);
                }
                if ((int)local_a870 < iVar3) {
                  iVar13 = iVar13 + (int)local_a8d8;
                  iVar14 = iVar13 * 2 + 1;
                  uVar27 = (ulong)local_a8d0 & 0xffffffff;
                  do {
                    if (iVar13 < 0) goto LAB_005bcc8b;
                    local_a8dc = iVar14;
                    iVar26 = sat_solver_addclause(s,&local_a8dc,(lit *)&local_a8d8);
                    if (iVar26 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                    ,0xb2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar14 = iVar14 + 2;
                    iVar13 = iVar13 + 1;
                    uVar11 = (int)uVar27 - 1;
                    uVar27 = (ulong)uVar11;
                  } while (uVar11 != 0);
                }
              }
              else {
                if (iVar13 < 0) goto LAB_005bcc8b;
                local_a8dc = iVar13 * 2 + 1;
                iVar13 = sat_solver_addclause(s,&local_a8dc,(lit *)&local_a8d8);
                if (iVar13 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                ,0xb8,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
              }
              ptVar17 = (timespec *)((long)&ptVar17->tv_sec + 1);
              ptVar9 = local_a880;
              uVar11 = local_a84c;
              uVar19 = local_a874;
            } while (ptVar17 != local_a888);
          }
          ptVar8 = (timespec *)((long)&ptVar9->tv_sec + 1);
          uVar27 = local_a8c8;
        } while (ptVar8 != (timespec *)(uVar30 & 0xffffffff));
        uVar16 = (uint)local_a868;
        uVar25 = local_a8a0;
        uVar30 = local_a8b0;
      }
      iVar13 = (int)uVar25;
      local_a830 = 1;
      if (1 < iVar13) {
        local_a830 = iVar13;
      }
      local_a7b0 = 1;
      if (1 < (int)uVar19) {
        local_a7b0 = (ulong)uVar19;
      }
      local_a7f8 = 1;
      if (1 < (int)uVar11) {
        local_a7f8 = (ulong)uVar11;
      }
      if (1 < (int)uVar11) {
        local_a7b8 = (ulong)(iVar13 + iVar3 + 0x10);
        local_a7c0 = (lit *)((long)&local_a788.tv_sec + (long)iVar13 * 4);
        local_a834 = (int)local_a860 * 0xc + (int)local_a8a8 * -0xc;
        local_a798 = (long)iVar3;
        local_a82c = -local_a8bc;
        local_a7a0 = (uVar25 & 0xffffffff) * 2;
        uVar11 = (int)local_a8b8 + iVar13;
        iVar14 = uVar16 + (int)local_a8a8;
        local_a7d0 = (ulong)uVar11;
        iVar13 = uVar11 - iVar14;
        local_a7c8 = (ulong)(iVar13 - 1);
        local_a7e0 = (ulong)(iVar14 * -2 + 7);
        local_a7e8 = (ulong)(iVar14 * -2 + 6);
        local_a7f0 = (ulong)(iVar14 * 2 ^ 0xfffffffe);
        local_a7d8 = (ulong)(iVar13 + 3);
        uVar27 = 1;
        do {
          local_a808 = uVar27 + 1;
          if (1 < (int)local_a874) {
            uVar24 = 1;
            local_a7a8 = (long)local_a2c8 + (uVar27 - 1) * 0x198;
            local_a840 = uVar27;
            do {
              uVar11 = *(uint *)((long)local_a2c8 + uVar24 * 4 + uVar27 * 0x198);
              local_a858 = (ulong)uVar11;
              local_a828[3] = (int)uVar25;
              uVar19 = uVar11 + local_a828[3];
              local_a8d8 = (timespec *)(ulong)uVar19;
              iVar13 = (int)local_a7b8 + uVar11;
              local_a818[0] = *(int *)(local_a7a8 + uVar24 * 4);
              local_a828[0] = local_a818[0] + local_a828[3];
              local_a818[1] = (&iStack_a2cc)[uVar27 * 0x66 + uVar24];
              local_a828[1] = (&iStack_a2cc)[uVar27 * 0x66 + uVar24] + local_a828[3];
              local_a818[2] = *(int *)((long)local_a2c8 + uVar24 * 4 + local_a808 * 0x198);
              local_a828[2] = local_a818[2] + local_a828[3];
              local_a818[3] = *(int *)((long)local_a2c8 + uVar24 * 4 + uVar27 * 0x198 + 4);
              local_a828[3] = local_a818[3] + local_a828[3];
              if (iVar3 < 1) {
                uVar21 = uVar24;
                if (iVar13 < 0) goto LAB_005bcc8b;
              }
              else {
                iVar26 = uVar19 * 2 + 1;
                iVar14 = 0;
                local_a868 = uVar24;
                do {
                  if (((int)uVar19 < 0) || (local_a788.tv_sec._0_4_ = iVar26, iVar13 < 0))
                  goto LAB_005bcc8b;
                  local_a788.tv_sec._4_4_ = iVar13 * 2;
                  iVar4 = sat_solver_addclause(s,(lit *)&local_a788,(lit *)&local_a788.tv_nsec);
                  if (iVar4 == 0) {
                    pcVar23 = "RetValue";
                    pcVar20 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                    ;
                    pcVar22 = "void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)";
                    goto LAB_005bd123;
                  }
                  iVar14 = iVar14 + -1;
                  iVar26 = iVar26 + 2;
                  uVar19 = uVar19 + 1;
                  uVar21 = local_a868;
                  uVar25 = local_a8a0;
                  uVar27 = local_a840;
                  uVar30 = local_a8b0;
                } while (local_a82c != iVar14);
              }
              iVar13 = iVar13 * 2 + 1;
              local_a788.tv_sec._0_4_ = iVar13;
              if (1 < (int)uVar25) {
                lVar12 = 2;
                do {
                  if ((int)local_a858 + 1 < 0) goto LAB_005bcc8b;
                  *(int *)((long)&local_a788.tv_sec + lVar12 * 2) =
                       (int)local_a858 * 2 + (int)lVar12;
                  lVar12 = lVar12 + 2;
                } while (local_a7a0 != lVar12);
              }
              iVar14 = sat_solver_addclause(s,(lit *)&local_a788,local_a7c0);
              if (iVar14 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                              ,0xe2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
              iVar14 = ((int)local_a7c8 + (int)local_a858) * 2;
              lVar12 = 0;
              do {
                local_a788.tv_sec._0_4_ = iVar13;
                if (iVar3 + (int)local_a8d8 + (int)lVar12 < 0) goto LAB_005bcc8b;
                local_a778[lVar12 + -3] = iVar14;
                lVar12 = lVar12 + 1;
                iVar14 = iVar14 + 2;
              } while (lVar12 != 0x10);
              iVar13 = sat_solver_addclause(s,(lit *)&local_a788,local_a744);
              if (iVar13 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                              ,0xe9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
              uVar24 = uVar21 + 1;
              if (1 < (int)uVar25) {
                iVar13 = (int)local_a7d0 + (int)local_a858;
                local_a880 = (timespec *)((ulong)(uint)((int)local_a7f0 + iVar13 * 2) + 1);
                local_a860 = CONCAT44(local_a860._4_4_,(int)local_a7e0 + iVar13 * 2);
                local_a888 = (timespec *)
                             CONCAT44(local_a888._4_4_,(int)local_a7d8 + (int)local_a858);
                local_a8d0 = (timespec *)((ulong)(uint)((int)local_a7e8 + iVar13 * 2) + 1);
                iVar13 = 1;
                local_a868 = uVar21 + 1;
                do {
                  if (0 < iVar3) {
                    if (iVar13 + (int)local_a858 < 0) goto LAB_005bcc8b;
                    iVar14 = (iVar13 + (int)local_a858) * 2 + 1;
                    uVar11 = 0;
                    do {
                      iVar26 = ((int)local_a8d8 + uVar11) * 2 + 1;
                      lVar12 = 0;
                      do {
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        iVar15 = (int)local_a880 + (int)lVar12;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        iVar4 = *(int *)((long)local_a818 + lVar12 * 2);
                        iVar28 = iVar4 + iVar13;
                        if (iVar28 == 0 || SCARRY4(iVar4,iVar13) != iVar28 < 0) goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = iVar28 * 2 + -2;
                        iVar4 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar4 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0xf9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        iVar4 = *(int *)((long)local_a828 + lVar12 * 2) + uVar11;
                        if (iVar4 < 0) goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = iVar4 * 2;
                        iVar4 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar4 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x100,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        lVar12 = lVar12 + 2;
                      } while (lVar12 != 8);
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != local_a8bc);
                  }
                  iVar14 = (int)local_a870;
                  if (0 < iVar14) {
                    iVar26 = 0;
                    do {
                      if (iVar26 + (int)local_a8d8 < 0) goto LAB_005bcc8b;
                      iVar4 = (iVar26 + (int)local_a8d8) * 2 + 1;
                      iVar15 = 0;
                      iVar28 = (int)local_a860;
                      do {
                        local_a788.tv_sec._0_4_ = iVar4;
                        if ((int)local_a888 + iVar15 < 0) goto LAB_005bcc8b;
                        local_a788.tv_sec._4_4_ = iVar28;
                        iVar5 = sat_solver_addclause
                                          (s,(lit *)&local_a788,(lit *)&local_a788.tv_nsec);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x109,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        iVar15 = iVar15 + 1;
                        iVar28 = iVar28 + 2;
                      } while (iVar15 != 0xc);
                      iVar26 = iVar26 + 1;
                    } while (iVar26 != iVar14);
                  }
                  if (iVar14 < iVar3) {
                    uVar11 = (int)local_a858 + iVar13;
                    local_a790 = (ulong)uVar11;
                    iVar14 = uVar11 * 2 + 1;
                    uVar27 = local_a800;
                    do {
                      local_a890 = (timespec *)(long)aiStack_a600[uVar27 * 2 + 2];
                      if (((long)local_a890 < 0) ||
                         (local_a898 = (timespec *)(long)aiStack_a600[uVar27 * 2 + 3],
                         (long)local_a898 < 0)) {
                        __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                      ,0x110,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                      }
                      if (((long)uVar27 <= (long)local_a890) || ((long)uVar27 <= (long)local_a898))
                      {
                        __assert_fail("pN[g][0] < g && pN[g][1] < g",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                      ,0x111,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                      }
                      if ((int)local_a790 < 0) goto LAB_005bcc8b;
                      iVar26 = ((int)local_a8d8 + (int)uVar27) * 2 + 1;
                      lVar12 = 0;
                      local_a8a8 = uVar27;
                      do {
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        iVar15 = (int)local_a8d0 + (int)lVar12;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        iVar4 = (&DAT_00a0c340)[lVar12];
                        iVar28 = local_a818[iVar4] + iVar13;
                        if (iVar28 == 0 || SCARRY4(local_a818[iVar4],iVar13) != iVar28 < 0)
                        goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = iVar28 * 2 + -2;
                        iVar28 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar28 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x118,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        iVar28 = (&DAT_00a0c344)[lVar12];
                        iVar5 = local_a818[iVar28] + iVar13;
                        if (iVar5 == 0 || SCARRY4(local_a818[iVar28],iVar13) != iVar5 < 0)
                        goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = iVar5 * 2 + -2;
                        iVar5 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x11f,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        if (local_a828[iVar4] + (int)local_a890 < 0) goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = (local_a828[iVar4] + (int)local_a890) * 2;
                        iVar4 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar4 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x127,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar14;
                        local_a788.tv_sec._4_4_ = iVar26;
                        local_a788.tv_nsec._0_4_ = iVar15;
                        if (local_a828[iVar28] + (int)local_a898 < 0) goto LAB_005bcc8b;
                        local_a788.tv_nsec._4_4_ = (local_a828[iVar28] + (int)local_a898) * 2;
                        iVar4 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar4 == 0) {
                          pcVar23 = "RetValue";
                          pcVar20 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                          ;
                          pcVar22 = "void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)";
                          goto LAB_005bcca0;
                        }
                        lVar12 = lVar12 + 2;
                      } while (lVar12 != 0x18);
                      uVar27 = local_a8a8 + 1;
                    } while ((long)uVar27 < local_a798);
                  }
                  iVar13 = iVar13 + 1;
                  uVar24 = local_a868;
                  uVar25 = local_a8a0;
                  uVar27 = local_a840;
                  uVar30 = local_a8b0;
                } while (iVar13 != local_a830);
              }
            } while (uVar24 != local_a7b0);
          }
          uVar27 = local_a808;
        } while (local_a808 != local_a7f8);
      }
      uVar11 = iVar3 + (int)uVar25;
      local_a8d8 = (timespec *)(ulong)uVar11;
      local_a12c = local_a12c + uVar11;
      if (local_a12c < 1) {
LAB_005bcc8b:
        pcVar23 = "Var >= 0 && !(c >> 1)";
        pcVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
        ;
        pcVar22 = "int Abc_Var2Lit(int, int)";
LAB_005bcca0:
        __assert_fail(pcVar23,pcVar20,0x12e,pcVar22);
      }
      local_a8dc = local_a12c * 2 + -2;
      begin = &local_a8dc;
      iVar13 = sat_solver_addclause(s,begin,(lit *)&local_a8d8);
      if (iVar13 == 0) {
        printf("Problem has no solution. ");
        aVar7 = Abc_Clock();
        Abc_PrintTime((int)aVar7 - (int)local_a848,(char *)begin,time);
      }
      else {
        if (local_a878 != 0) {
          printf("Finished adding %d clauses. Started solving...\n");
        }
        local_a888 = (timespec *)(ulong)local_a874;
        local_a880 = (timespec *)(ulong)local_a84c;
        local_a8d0 = (timespec *)(uVar30 & 0xffffffff);
        ptVar8 = (timespec *)(local_a8c8 & 0xffffffff);
        while( true ) {
          uVar31 = 0;
          iVar13 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
          uVar32 = (undefined4)((ulong)uVar31 >> 0x20);
          if (iVar13 != 1) break;
          if ((int)uVar30 < 1) {
            pcVar22 = "Satisfying solution found. ";
            goto LAB_005bcd0d;
          }
          ptVar17 = (timespec *)0x0;
          ptVar9 = local_a2c8;
          iVar14 = 0;
          do {
            if (0 < (int)local_a8c8) {
              ptVar29 = (timespec *)0x0;
              local_a898 = ptVar9;
              local_a890 = ptVar17;
              do {
                if ((ptVar17 == (timespec *)0x0) ||
                   ((ptVar29 == (timespec *)0x0 || ptVar17 == local_a880) || local_a888 == ptVar29))
                {
                  iVar26 = *(int *)((long)&ptVar9->tv_sec + (long)ptVar29 * 4) + (int)uVar25;
                  iVar26 = Bmc_MeshAddOneHotness2(s,iVar26,iVar26 + iVar3);
                  iVar14 = iVar14 + iVar26;
                }
                else {
                  iVar26 = *(int *)((long)&ptVar9->tv_sec + (long)ptVar29 * 4);
                  iVar28 = iVar26 + (int)uVar25;
                  iVar26 = Bmc_MeshAddOneHotness2(s,iVar26,iVar28);
                  iVar4 = Bmc_MeshAddOneHotness2(s,iVar28,iVar28 + iVar3);
                  ptVar17 = local_a890;
                  ptVar9 = local_a898;
                  uVar25 = local_a8a0;
                  iVar28 = Bmc_MeshAddOneHotness2(s,iVar28 + iVar3,iVar3 + iVar28 + 0x10);
                  iVar14 = iVar28 + iVar4 + iVar26 + iVar14;
                }
                ptVar29 = (timespec *)((long)&ptVar29->tv_sec + 1);
              } while (ptVar8 != ptVar29);
            }
            uVar32 = (undefined4)((ulong)uVar31 >> 0x20);
            ptVar17 = (timespec *)((long)&ptVar17->tv_sec + 1);
            ptVar9 = (timespec *)&ptVar9[0x19].tv_nsec;
          } while (ptVar17 != local_a8d0);
          if (iVar14 < 1) {
            pcVar22 = "Satisfying solution found. ";
            uVar30 = local_a8b0;
            goto LAB_005bcd0d;
          }
          printf("Adding %d one-hotness clauses.\n");
          uVar30 = local_a8b0;
        }
        pcVar22 = "Problem has no solution. ";
        if (iVar13 != -1) {
          if (iVar13 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                          ,0x159,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
          pcVar22 = "Computation timed out. ";
        }
LAB_005bcd0d:
        printf(pcVar22);
        iVar26 = 3;
        iVar14 = clock_gettime(3,&local_a788);
        if (iVar14 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = CONCAT44(local_a788.tv_nsec._4_4_,(int)local_a788.tv_nsec) / 1000 +
                   CONCAT44(local_a788.tv_sec._4_4_,(int)local_a788.tv_sec) * 1000000;
        }
        lVar12 = lVar12 - local_a848;
        iVar14 = 0;
        Abc_Print(iVar26,"%s =","Time");
        Abc_Print(iVar26,"%9.2f sec\n",(double)lVar12 / 1000000.0);
        if (iVar13 == 1) {
          uVar27 = 0;
          uVar11 = (uint)uVar30;
          if (2 < (int)local_a8c8) {
            uVar27 = 0;
            ptVar8 = (timespec *)0x1;
            iVar14 = 0;
            do {
              if (2 < (int)uVar11) {
                ptVar9 = (timespec *)0x1;
                do {
                  iVar13 = *(int *)((long)local_a2c8 + (long)ptVar8 * 4 + (long)ptVar9 * 0x198);
                  uVar19 = (int)local_a8d8 + iVar13;
                  uVar24 = (ulong)uVar19;
                  lVar12 = 4;
                  do {
                    if (((int)uVar24 < 0) || (s->size <= (int)uVar24)) goto LAB_005bd10e;
                    iVar14 = iVar14 + (uint)(s->model[uVar24] == 1);
                    uVar24 = uVar24 + 1;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  lVar12 = 4;
                  do {
                    if (((int)(iVar13 + (((int)local_a8b8 + (int)uVar25) - local_a850) + 3) < 0) ||
                       ((long)s->size <= (int)uVar19 + lVar12)) goto LAB_005bd10e;
                    uVar27 = (ulong)((int)uVar27 + (uint)(s->model[(int)uVar19 + lVar12] == 1));
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 0x10);
                  ptVar9 = (timespec *)((long)&ptVar9->tv_sec + 1);
                } while (ptVar9 != local_a880);
              }
              ptVar8 = (timespec *)((long)&ptVar8->tv_sec + 1);
            } while (ptVar8 != local_a888);
          }
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,uVar30 & 0xffffffff,local_a8c8,uVar25 & 0xffffffff,
                 (ulong)(uint)((int)uVar27 + iVar14),uVar27,CONCAT44(uVar32,iVar14));
          printf(" Y\\X ");
          if (0 < (int)uVar11) {
            uVar27 = 0;
            do {
              printf("  %-2d ",uVar27);
              uVar19 = (int)uVar27 + 1;
              uVar27 = (ulong)uVar19;
            } while (uVar11 != uVar19);
          }
          putchar(10);
          uVar27 = 0;
          if (0 < (int)uVar25) {
            uVar27 = uVar25 & 0xffffffff;
          }
          local_a8d0 = (timespec *)0x0;
          if (0 < (int)uVar11) {
            local_a8d0 = (timespec *)(uVar30 & 0xffffffff);
          }
          uVar24 = 0;
          if (0 < (int)local_a8c8) {
            uVar24 = local_a8c8;
          }
          if (0 < (int)local_a8c8) {
            uVar21 = (ulong)local_a8bc;
            ptVar8 = (timespec *)0x0;
            do {
              printf(" %-2d  ",(ulong)ptVar8 & 0xffffffff);
              if (0 < (int)uVar30) {
                ptVar9 = (timespec *)0x0;
                local_a8d8 = ptVar8;
                do {
                  if ((int)uVar25 < 1) {
LAB_005bd036:
                    pcVar22 = "     ";
                    if (ptVar9 == local_a880) {
                      pcVar22 = "  *  ";
                    }
                    if (ptVar8 == (timespec *)0x0) {
                      pcVar22 = "  *  ";
                    }
                    if (ptVar8 == local_a888) {
                      pcVar22 = "  *  ";
                    }
                    if (ptVar9 == (timespec *)0x0) {
                      pcVar22 = "  *  ";
                    }
                    printf(pcVar22);
                  }
                  else {
                    iVar13 = *(int *)((long)local_a2c8 + (long)ptVar8 * 4 + (long)ptVar9 * 0x198);
                    local_a890 = (timespec *)(long)iVar13;
                    iVar13 = iVar13 + (int)uVar25;
                    bVar2 = false;
                    uVar30 = 0;
                    local_a898 = ptVar9;
                    do {
                      if (0 < iVar3) {
                        puVar18 = (undefined1 *)((long)&local_a890->tv_sec + uVar30);
                        if ((long)puVar18 < 0) {
LAB_005bd10e:
                          pcVar23 = "v >= 0 && v < s->size";
                          pcVar20 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ;
                          pcVar22 = "int sat_solver_var_value(sat_solver *, int)";
LAB_005bd123:
                          __assert_fail(pcVar23,pcVar20,0xda,pcVar22);
                        }
                        uVar25 = 0;
                        do {
                          if ((long)s->size <= (long)puVar18) goto LAB_005bd10e;
                          if (s->model[(long)puVar18] == 1) {
                            if ((uint)s->size <= (uint)(iVar13 + (int)uVar25)) goto LAB_005bd10e;
                            if (s->model[(long)iVar13 + uVar25] == 1) {
                              printf(" %c%-2d ",(ulong)((int)uVar25 + 0x61),uVar30 & 0xffffffff);
                              bVar2 = true;
                            }
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar21 != uVar25);
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar27);
                    ptVar9 = local_a898;
                    uVar25 = local_a8a0;
                    ptVar8 = local_a8d8;
                    uVar30 = local_a8b0;
                    if (!bVar2) goto LAB_005bd036;
                  }
                  ptVar9 = (timespec *)((long)&ptVar9->tv_sec + 1);
                } while (ptVar9 != local_a8d0);
              }
              putchar(10);
              ptVar8 = (timespec *)((long)&ptVar8->tv_sec + 1);
            } while (ptVar8 != (timespec *)(uVar24 & 0xffffffff));
          }
        }
      }
      sat_solver_delete(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                ,0x79,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
//    sat_solver * pSat = satoko_create();
    sat_solver * pSat = sat_solver_new();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );
                assert( pN[g][0] <  g && pN[g][1] <  g );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//            satoko_destroy( pSat );
            sat_solver_delete( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
//        status = satoko_solve( pSat );
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
//        if ( status == SATOKO_UNSAT )
        if ( status == l_False )
        {
            printf( "Problem has no solution. " );
            break;
        }
//        if ( status == SATOKO_UNDEC )
        if ( status == l_Undef )
        {
            printf( "Computation timed out. " );
            break;
        }
//        assert( status == SATOKO_SAT );
        assert( status == l_True );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
//        iVar = satoko_varnum(pSat);
        iVar = sat_solver_nvars(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue2(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    if ( status == SATOKO_SAT )
    if ( status == l_True )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue2(pSat, iTVar+t) && Bmc_MeshVarValue2(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    //satoko_destroy( pSat );
    sat_solver_delete( pSat );
}